

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddApa.c
# Opt level: O0

DdApaDigit Cudd_ApaSubtract(int digits,DdApaNumber a,DdApaNumber b,DdApaNumber diff)

{
  ulong local_38;
  DdApaDoubleDigit partial;
  int i;
  DdApaNumber diff_local;
  DdApaNumber b_local;
  DdApaNumber a_local;
  int digits_local;
  
  local_38 = 0x100000000;
  for (partial._4_4_ = digits + -1; -1 < partial._4_4_; partial._4_4_ = partial._4_4_ + -1) {
    local_38 = ((local_38 >> 0x20) + 0xffffffff + (ulong)a[partial._4_4_]) - (ulong)b[partial._4_4_]
    ;
    diff[partial._4_4_] = (DdApaDigit)local_38;
  }
  return (int)(local_38 >> 0x20) - 1;
}

Assistant:

DdApaDigit
Cudd_ApaSubtract(
  int  digits,
  DdApaNumber  a,
  DdApaNumber  b,
  DdApaNumber  diff)
{
    int i;
    DdApaDoubleDigit partial = DD_APA_BASE;

    for (i = digits - 1; i >= 0; i--) {
        partial = DD_MSDIGIT(partial) + DD_APA_MASK + a[i] - b[i];
        diff[i] = (DdApaDigit) DD_LSDIGIT(partial);
    }
    return((DdApaDigit) DD_MSDIGIT(partial) - 1);

}